

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPrsBuild.c
# Opt level: O0

void Psr_ManRemapBoxes(Bac_Man_t *pNew,Vec_Ptr_t *vDes,Psr_Ntk_t *pNtk,Vec_Int_t *vMap)

{
  int iVar1;
  int iVar2;
  char *pName;
  Psr_Ntk_t *pNtkBox;
  bool bVar3;
  int NtkIdNew;
  int NtkId;
  int iBox;
  Vec_Int_t *vSigs;
  Vec_Int_t *vMap_local;
  Psr_Ntk_t *pNtk_local;
  Vec_Ptr_t *vDes_local;
  Bac_Man_t *pNew_local;
  
  NtkIdNew = 0;
  while( true ) {
    iVar1 = Psr_NtkBoxNum(pNtk);
    bVar3 = false;
    if (NtkIdNew < iVar1) {
      _NtkId = Psr_BoxSignals(pNtk,NtkIdNew);
      bVar3 = _NtkId != (Vec_Int_t *)0x0;
    }
    if (!bVar3) break;
    iVar1 = Psr_BoxIsNode(pNtk,NtkIdNew);
    if (iVar1 == 0) {
      iVar1 = Psr_BoxNtk(pNtk,NtkIdNew);
      pName = Psr_NtkStr(pNtk,iVar1);
      iVar1 = Bac_ManNtkFindId(pNew,pName);
      if (iVar1 < 1) {
        __assert_fail("NtkIdNew > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacPrsBuild.c"
                      ,0x88,
                      "void Psr_ManRemapBoxes(Bac_Man_t *, Vec_Ptr_t *, Psr_Ntk_t *, Vec_Int_t *)");
      }
      Psr_BoxSetNtk(pNtk,NtkIdNew,iVar1);
      iVar2 = Bac_ManNtkNum(pNew);
      if (iVar1 <= iVar2) {
        pNtkBox = Psr_ManNtk(vDes,iVar1 + -1);
        Psr_ManRemapOne(_NtkId,pNtkBox,vMap);
      }
    }
    NtkIdNew = NtkIdNew + 1;
  }
  return;
}

Assistant:

void Psr_ManRemapBoxes( Bac_Man_t * pNew, Vec_Ptr_t * vDes, Psr_Ntk_t * pNtk, Vec_Int_t * vMap )
{
    Vec_Int_t * vSigs; int iBox;
    Psr_NtkForEachBox( pNtk, vSigs, iBox )
        if ( !Psr_BoxIsNode(pNtk, iBox) )
        {
            int NtkId = Psr_BoxNtk( pNtk, iBox );
            int NtkIdNew = Bac_ManNtkFindId( pNew, Psr_NtkStr(pNtk, NtkId) );
            assert( NtkIdNew > 0 );
            Psr_BoxSetNtk( pNtk, iBox, NtkIdNew );
            if ( NtkIdNew <= Bac_ManNtkNum(pNew) )
                Psr_ManRemapOne( vSigs, Psr_ManNtk(vDes, NtkIdNew-1), vMap );
            //else
            //    Psr_ManRemapGate( vSigs );
        }
}